

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
               (Nonzero<double> *keys,int end,IdxCompare *compare,int start)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  Element *e2;
  int iVar8;
  Nonzero<double> tempkey;
  
  uVar4 = 2;
  do {
    if ((int)uVar4 < 0) {
      return;
    }
    iVar2 = SPxShellsort<soplex::Nonzero<double>,_soplex::SPxMainSM<double>::IdxCompare>::incs
            [uVar4];
    iVar6 = start;
    for (lVar5 = (long)(iVar2 + start); lVar5 <= end; lVar5 = lVar5 + 1) {
      pNVar1 = keys + lVar5;
      tempkey.val = pNVar1->val;
      tempkey.idx = pNVar1->idx;
      tempkey._12_4_ = *(undefined4 *)&pNVar1->field_0xc;
      for (iVar7 = iVar6; iVar8 = iVar2 + iVar7, iVar2 + start <= iVar8; iVar7 = iVar7 - iVar2) {
        e2 = keys + iVar7;
        iVar3 = SPxMainSM<double>::IdxCompare::operator()(compare,&tempkey,e2);
        if (-1 < iVar3) break;
        keys[iVar8].idx = e2->idx;
        keys[iVar8].val = e2->val;
      }
      keys[iVar8].idx = tempkey.idx;
      keys[iVar8].val = tempkey.val;
      iVar6 = iVar6 + 1;
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}